

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O2

int __thiscall TinyProcessLib::Process::open(Process *this,char *__file,int __oflag,...)

{
  int iVar1;
  environment_type *in_RCX;
  int __oflag_00;
  environment_type *environment_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  environment_local = in_RCX;
  local_38._M_unused._M_object = operator_new(0x18);
  *(char **)local_38._M_unused._0_8_ = __file;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = ___oflag;
  *(environment_type ***)((long)local_38._M_unused._0_8_ + 0x10) = &environment_local;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/tiny-process-library/process_unix.cpp:164:15)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/tiny-process-library/process_unix.cpp:164:15)>
             ::_M_manager;
  iVar1 = open(this,local_38._M_pod_data,__oflag_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return iVar1;
}

Assistant:

Process::id_type Process::open(const std::string &command, const std::string &path, const environment_type *environment) noexcept {
  return open([&command, &path, &environment] {
    if(!path.empty()) {
      if(chdir(path.c_str()) != 0)
        exit(1);
    }

    if(!environment)
      execl("/bin/sh", "/bin/sh", "-c", command.c_str(), nullptr);
    else {
      std::vector<std::string> env_strs;
      std::vector<const char *> env_ptrs;
      env_strs.reserve(environment->size());
      env_ptrs.reserve(environment->size() + 1);
      for(const auto &e : *environment) {
        env_strs.emplace_back(e.first + '=' + e.second);
        env_ptrs.emplace_back(env_strs.back().c_str());
      }
      env_ptrs.emplace_back(nullptr);
      execle("/bin/sh", "/bin/sh", "-c", command.c_str(), nullptr, env_ptrs.data());
    }
  });
}